

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

gc_function * __thiscall
mjs::gc_heap_ptr_untracked<mjs::gc_function,_true>::dereference
          (gc_heap_ptr_untracked<mjs::gc_function,_true> *this,gc_heap *h)

{
  bool bVar1;
  slot *psVar2;
  gc_heap *h_local;
  gc_heap_ptr_untracked<mjs::gc_function,_true> *this_local;
  
  bVar1 = gc_heap::type_check<mjs::gc_function>(h,this->pos_);
  if (!bVar1) {
    __assert_fail("h.type_check<T>(pos_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x1db,
                  "T &mjs::gc_heap_ptr_untracked<mjs::gc_function>::dereference(gc_heap &) const [T = mjs::gc_function, strong = true]"
                 );
  }
  psVar2 = gc_heap::get_at(h,this->pos_);
  return (gc_function *)psVar2;
}

Assistant:

T& dereference(gc_heap& h) const {
        assert(h.type_check<T>(pos_));
        return *reinterpret_cast<T*>(h.get_at(pos_));
    }